

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  uchar local_138 [8];
  uchar msgmod32 [32];
  secp256k1_scalar msg;
  undefined1 local_f0 [4];
  uint i;
  secp256k1_rfc6979_hmac_sha256 rng;
  uint offset;
  uchar keydata [112];
  uint counter_local;
  void *data_local;
  uchar *algo16_local;
  uchar *key32_local;
  uchar *msg32_local;
  uchar *nonce32_local;
  
  rng.k[0x1c] = '\0';
  rng.k[0x1d] = '\0';
  rng.k[0x1e] = '\0';
  rng.k[0x1f] = '\0';
  secp256k1_scalar_set_b32((secp256k1_scalar *)(msgmod32 + 0x18),msg32,(int *)0x0);
  secp256k1_scalar_get_b32(local_138,(secp256k1_scalar *)(msgmod32 + 0x18));
  buffer_append((uchar *)&rng.retry,(uint *)(rng.k + 0x1c),key32,0x20);
  buffer_append((uchar *)&rng.retry,(uint *)(rng.k + 0x1c),local_138,0x20);
  if (data != (void *)0x0) {
    buffer_append((uchar *)&rng.retry,(uint *)(rng.k + 0x1c),data,0x20);
  }
  if (algo16 != (uchar *)0x0) {
    buffer_append((uchar *)&rng.retry,(uint *)(rng.k + 0x1c),algo16,0x10);
  }
  secp256k1_rfc6979_hmac_sha256_initialize
            ((secp256k1_rfc6979_hmac_sha256 *)local_f0,(uchar *)&rng.retry,(ulong)(uint)rng.k._28_4_
            );
  memset(&rng.retry,0,0x70);
  for (msg.d[3]._4_4_ = 0; msg.d[3]._4_4_ <= counter; msg.d[3]._4_4_ = msg.d[3]._4_4_ + 1) {
    secp256k1_rfc6979_hmac_sha256_generate((secp256k1_rfc6979_hmac_sha256 *)local_f0,nonce32,0x20);
  }
  secp256k1_rfc6979_hmac_sha256_finalize((secp256k1_rfc6979_hmac_sha256 *)local_f0);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   unsigned int offset = 0;
   secp256k1_rfc6979_hmac_sha256 rng;
   unsigned int i;
   secp256k1_scalar msg;
   unsigned char msgmod32[32];
   secp256k1_scalar_set_b32(&msg, msg32, NULL);
   secp256k1_scalar_get_b32(msgmod32, &msg);
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and reduced message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   buffer_append(keydata, &offset, key32, 32);
   buffer_append(keydata, &offset, msgmod32, 32);
   if (data != NULL) {
       buffer_append(keydata, &offset, data, 32);
   }
   if (algo16 != NULL) {
       buffer_append(keydata, &offset, algo16, 16);
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, offset);
   memset(keydata, 0, sizeof(keydata));
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);
   return 1;
}